

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_add_ge(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int degenerate;
  int infinity;
  secp256k1_fe rr_alt;
  secp256k1_fe m_alt;
  secp256k1_fe rr;
  secp256k1_fe q;
  secp256k1_fe n;
  secp256k1_fe m;
  secp256k1_fe tt;
  secp256k1_fe t;
  secp256k1_fe s2;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe zz;
  secp256k1_ge *b_local;
  secp256k1_gej *a_local;
  secp256k1_gej *r_local;
  
  secp256k1_fe_sqr((secp256k1_fe *)(u1.n + 8),&a->z);
  memcpy(u2.n + 8,a,0x28);
  secp256k1_fe_normalize_weak((secp256k1_fe *)(u2.n + 8));
  secp256k1_fe_mul((secp256k1_fe *)(s1.n + 8),&b->x,(secp256k1_fe *)(u1.n + 8));
  memcpy(s2.n + 8,&a->y,0x28);
  secp256k1_fe_normalize_weak((secp256k1_fe *)(s2.n + 8));
  secp256k1_fe_mul((secp256k1_fe *)(t.n + 8),&b->y,(secp256k1_fe *)(u1.n + 8));
  secp256k1_fe_mul((secp256k1_fe *)(t.n + 8),(secp256k1_fe *)(t.n + 8),&a->z);
  memcpy(tt.n + 8,u2.n + 8,0x28);
  secp256k1_fe_add((secp256k1_fe *)(tt.n + 8),(secp256k1_fe *)(s1.n + 8));
  memcpy(n.n + 8,s2.n + 8,0x28);
  secp256k1_fe_add((secp256k1_fe *)(n.n + 8),(secp256k1_fe *)(t.n + 8));
  secp256k1_fe_sqr((secp256k1_fe *)(m_alt.n + 8),(secp256k1_fe *)(tt.n + 8));
  secp256k1_fe_negate((secp256k1_fe *)(rr_alt.n + 8),(secp256k1_fe *)(s1.n + 8),1);
  secp256k1_fe_mul((secp256k1_fe *)(m.n + 8),(secp256k1_fe *)(u2.n + 8),
                   (secp256k1_fe *)(rr_alt.n + 8));
  secp256k1_fe_add((secp256k1_fe *)(m_alt.n + 8),(secp256k1_fe *)(m.n + 8));
  uVar2 = secp256k1_fe_normalizes_to_zero((secp256k1_fe *)(n.n + 8));
  uVar3 = secp256k1_fe_normalizes_to_zero((secp256k1_fe *)(m_alt.n + 8));
  uVar2 = uVar2 & uVar3;
  memcpy(&degenerate,s2.n + 8,0x28);
  secp256k1_fe_mul_int((secp256k1_fe *)&degenerate,2);
  secp256k1_fe_add((secp256k1_fe *)(rr_alt.n + 8),(secp256k1_fe *)(u2.n + 8));
  secp256k1_fe_cmov((secp256k1_fe *)&degenerate,(secp256k1_fe *)(m_alt.n + 8),
                    (uint)((uVar2 != 0 ^ 0xffU) & 1));
  secp256k1_fe_cmov((secp256k1_fe *)(rr_alt.n + 8),(secp256k1_fe *)(n.n + 8),
                    (uint)((uVar2 != 0 ^ 0xffU) & 1));
  secp256k1_fe_sqr((secp256k1_fe *)(q.n + 8),(secp256k1_fe *)(rr_alt.n + 8));
  secp256k1_fe_mul((secp256k1_fe *)(rr.n + 8),(secp256k1_fe *)(q.n + 8),(secp256k1_fe *)(tt.n + 8));
  secp256k1_fe_sqr((secp256k1_fe *)(q.n + 8),(secp256k1_fe *)(q.n + 8));
  secp256k1_fe_cmov((secp256k1_fe *)(q.n + 8),(secp256k1_fe *)(n.n + 8),uVar2);
  secp256k1_fe_sqr((secp256k1_fe *)(tt.n + 8),(secp256k1_fe *)&degenerate);
  secp256k1_fe_mul(&r->z,&a->z,(secp256k1_fe *)(rr_alt.n + 8));
  iVar4 = secp256k1_fe_normalizes_to_zero(&r->z);
  iVar1 = a->infinity;
  secp256k1_fe_mul_int(&r->z,2);
  secp256k1_fe_negate((secp256k1_fe *)(rr.n + 8),(secp256k1_fe *)(rr.n + 8),1);
  secp256k1_fe_add((secp256k1_fe *)(tt.n + 8),(secp256k1_fe *)(rr.n + 8));
  secp256k1_fe_normalize_weak((secp256k1_fe *)(tt.n + 8));
  memcpy(r,tt.n + 8,0x28);
  secp256k1_fe_mul_int((secp256k1_fe *)(tt.n + 8),2);
  secp256k1_fe_add((secp256k1_fe *)(tt.n + 8),(secp256k1_fe *)(rr.n + 8));
  secp256k1_fe_mul((secp256k1_fe *)(tt.n + 8),(secp256k1_fe *)(tt.n + 8),(secp256k1_fe *)&degenerate
                  );
  secp256k1_fe_add((secp256k1_fe *)(tt.n + 8),(secp256k1_fe *)(q.n + 8));
  secp256k1_fe_negate(&r->y,(secp256k1_fe *)(tt.n + 8),3);
  secp256k1_fe_normalize_weak(&r->y);
  secp256k1_fe_mul_int(&r->x,4);
  secp256k1_fe_mul_int(&r->y,4);
  secp256k1_fe_cmov(&r->x,&b->x,a->infinity);
  secp256k1_fe_cmov(&r->y,&b->y,a->infinity);
  secp256k1_fe_cmov(&r->z,&secp256k1_gej_add_ge::fe_1,a->infinity);
  r->infinity = iVar4 * (1 - iVar1);
  return;
}

Assistant:

static void secp256k1_gej_add_ge(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b) {
    /* Operations: 7 mul, 5 sqr, 4 normalize, 21 mul_int/add/negate/cmov */
    static const secp256k1_fe fe_1 = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 1);
    secp256k1_fe zz, u1, u2, s1, s2, t, tt, m, n, q, rr;
    secp256k1_fe m_alt, rr_alt;
    int infinity, degenerate;
    VERIFY_CHECK(!b->infinity);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);

    /** In:
     *    Eric Brier and Marc Joye, Weierstrass Elliptic Curves and Side-Channel Attacks.
     *    In D. Naccache and P. Paillier, Eds., Public Key Cryptography, vol. 2274 of Lecture Notes in Computer Science, pages 335-345. Springer-Verlag, 2002.
     *  we find as solution for a unified addition/doubling formula:
     *    lambda = ((x1 + x2)^2 - x1 * x2 + a) / (y1 + y2), with a = 0 for secp256k1's curve equation.
     *    x3 = lambda^2 - (x1 + x2)
     *    2*y3 = lambda * (x1 + x2 - 2 * x3) - (y1 + y2).
     *
     *  Substituting x_i = Xi / Zi^2 and yi = Yi / Zi^3, for i=1,2,3, gives:
     *    U1 = X1*Z2^2, U2 = X2*Z1^2
     *    S1 = Y1*Z2^3, S2 = Y2*Z1^3
     *    Z = Z1*Z2
     *    T = U1+U2
     *    M = S1+S2
     *    Q = T*M^2
     *    R = T^2-U1*U2
     *    X3 = 4*(R^2-Q)
     *    Y3 = 4*(R*(3*Q-2*R^2)-M^4)
     *    Z3 = 2*M*Z
     *  (Note that the paper uses xi = Xi / Zi and yi = Yi / Zi instead.)
     *
     *  This formula has the benefit of being the same for both addition
     *  of distinct points and doubling. However, it breaks down in the
     *  case that either point is infinity, or that y1 = -y2. We handle
     *  these cases in the following ways:
     *
     *    - If b is infinity we simply bail by means of a VERIFY_CHECK.
     *
     *    - If a is infinity, we detect this, and at the end of the
     *      computation replace the result (which will be meaningless,
     *      but we compute to be constant-time) with b.x : b.y : 1.
     *
     *    - If a = -b, we have y1 = -y2, which is a degenerate case.
     *      But here the answer is infinity, so we simply set the
     *      infinity flag of the result, overriding the computed values
     *      without even needing to cmov.
     *
     *    - If y1 = -y2 but x1 != x2, which does occur thanks to certain
     *      properties of our curve (specifically, 1 has nontrivial cube
     *      roots in our field, and the curve equation has no x coefficient)
     *      then the answer is not infinity but also not given by the above
     *      equation. In this case, we cmov in place an alternate expression
     *      for lambda. Specifically (y1 - y2)/(x1 - x2). Where both these
     *      expressions for lambda are defined, they are equal, and can be
     *      obtained from each other by multiplication by (y1 + y2)/(y1 + y2)
     *      then substitution of x^3 + 7 for y^2 (using the curve equation).
     *      For all pairs of nonzero points (a, b) at least one is defined,
     *      so this covers everything.
     */

    secp256k1_fe_sqr(&zz, &a->z);                       /* z = Z1^2 */
    u1 = a->x; secp256k1_fe_normalize_weak(&u1);        /* u1 = U1 = X1*Z2^2 (1) */
    secp256k1_fe_mul(&u2, &b->x, &zz);                  /* u2 = U2 = X2*Z1^2 (1) */
    s1 = a->y; secp256k1_fe_normalize_weak(&s1);        /* s1 = S1 = Y1*Z2^3 (1) */
    secp256k1_fe_mul(&s2, &b->y, &zz);                  /* s2 = Y2*Z1^2 (1) */
    secp256k1_fe_mul(&s2, &s2, &a->z);                  /* s2 = S2 = Y2*Z1^3 (1) */
    t = u1; secp256k1_fe_add(&t, &u2);                  /* t = T = U1+U2 (2) */
    m = s1; secp256k1_fe_add(&m, &s2);                  /* m = M = S1+S2 (2) */
    secp256k1_fe_sqr(&rr, &t);                          /* rr = T^2 (1) */
    secp256k1_fe_negate(&m_alt, &u2, 1);                /* Malt = -X2*Z1^2 */
    secp256k1_fe_mul(&tt, &u1, &m_alt);                 /* tt = -U1*U2 (2) */
    secp256k1_fe_add(&rr, &tt);                         /* rr = R = T^2-U1*U2 (3) */
    /** If lambda = R/M = 0/0 we have a problem (except in the "trivial"
     *  case that Z = z1z2 = 0, and this is special-cased later on). */
    degenerate = secp256k1_fe_normalizes_to_zero(&m) &
                 secp256k1_fe_normalizes_to_zero(&rr);
    /* This only occurs when y1 == -y2 and x1^3 == x2^3, but x1 != x2.
     * This means either x1 == beta*x2 or beta*x1 == x2, where beta is
     * a nontrivial cube root of one. In either case, an alternate
     * non-indeterminate expression for lambda is (y1 - y2)/(x1 - x2),
     * so we set R/M equal to this. */
    rr_alt = s1;
    secp256k1_fe_mul_int(&rr_alt, 2);       /* rr = Y1*Z2^3 - Y2*Z1^3 (2) */
    secp256k1_fe_add(&m_alt, &u1);          /* Malt = X1*Z2^2 - X2*Z1^2 */

    secp256k1_fe_cmov(&rr_alt, &rr, !degenerate);
    secp256k1_fe_cmov(&m_alt, &m, !degenerate);
    /* Now Ralt / Malt = lambda and is guaranteed not to be 0/0.
     * From here on out Ralt and Malt represent the numerator
     * and denominator of lambda; R and M represent the explicit
     * expressions x1^2 + x2^2 + x1x2 and y1 + y2. */
    secp256k1_fe_sqr(&n, &m_alt);                       /* n = Malt^2 (1) */
    secp256k1_fe_mul(&q, &n, &t);                       /* q = Q = T*Malt^2 (1) */
    /* These two lines use the observation that either M == Malt or M == 0,
     * so M^3 * Malt is either Malt^4 (which is computed by squaring), or
     * zero (which is "computed" by cmov). So the cost is one squaring
     * versus two multiplications. */
    secp256k1_fe_sqr(&n, &n);
    secp256k1_fe_cmov(&n, &m, degenerate);              /* n = M^3 * Malt (2) */
    secp256k1_fe_sqr(&t, &rr_alt);                      /* t = Ralt^2 (1) */
    secp256k1_fe_mul(&r->z, &a->z, &m_alt);             /* r->z = Malt*Z (1) */
    infinity = secp256k1_fe_normalizes_to_zero(&r->z) * (1 - a->infinity);
    secp256k1_fe_mul_int(&r->z, 2);                     /* r->z = Z3 = 2*Malt*Z (2) */
    secp256k1_fe_negate(&q, &q, 1);                     /* q = -Q (2) */
    secp256k1_fe_add(&t, &q);                           /* t = Ralt^2-Q (3) */
    secp256k1_fe_normalize_weak(&t);
    r->x = t;                                           /* r->x = Ralt^2-Q (1) */
    secp256k1_fe_mul_int(&t, 2);                        /* t = 2*x3 (2) */
    secp256k1_fe_add(&t, &q);                           /* t = 2*x3 - Q: (4) */
    secp256k1_fe_mul(&t, &t, &rr_alt);                  /* t = Ralt*(2*x3 - Q) (1) */
    secp256k1_fe_add(&t, &n);                           /* t = Ralt*(2*x3 - Q) + M^3*Malt (3) */
    secp256k1_fe_negate(&r->y, &t, 3);                  /* r->y = Ralt*(Q - 2x3) - M^3*Malt (4) */
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_mul_int(&r->x, 4);                     /* r->x = X3 = 4*(Ralt^2-Q) */
    secp256k1_fe_mul_int(&r->y, 4);                     /* r->y = Y3 = 4*Ralt*(Q - 2x3) - 4*M^3*Malt (4) */

    /** In case a->infinity == 1, replace r with (b->x, b->y, 1). */
    secp256k1_fe_cmov(&r->x, &b->x, a->infinity);
    secp256k1_fe_cmov(&r->y, &b->y, a->infinity);
    secp256k1_fe_cmov(&r->z, &fe_1, a->infinity);
    r->infinity = infinity;
}